

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverApi.c
# Opt level: O1

Msat_Solver_t *
Msat_SolverAlloc(int nVarsAlloc,double dClaInc,double dClaDecay,double dVarInc,double dVarDecay,
                int fVerbose)

{
  Msat_Solver_t *pSat;
  Msat_ClauseVec_t *pMVar1;
  double *__s;
  float *pfVar2;
  int *piVar3;
  int *piVar4;
  Msat_Order_t *pMVar5;
  Msat_ClauseVec_t **ppMVar6;
  Msat_Queue_t *pMVar7;
  Msat_IntVec_t *pMVar8;
  Msat_Clause_t **__s_00;
  Msat_MmStep_t *pMVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  size_t sVar15;
  
  pSat = (Msat_Solver_t *)malloc(0x148);
  memset(pSat,0,0x148);
  pSat->nVarsAlloc = nVarsAlloc;
  pSat->nVars = 0;
  pSat->nClauses = 0;
  pMVar1 = Msat_ClauseVecAlloc(0x200);
  pSat->vClauses = pMVar1;
  pMVar1 = Msat_ClauseVecAlloc(0x200);
  pSat->vLearned = pMVar1;
  pSat->dClaInc = dClaInc;
  pSat->dClaDecay = dClaDecay;
  pSat->dVarInc = dVarInc;
  pSat->dVarDecay = dVarDecay;
  lVar12 = (long)pSat->nVarsAlloc;
  __s = (double *)malloc(lVar12 * 8);
  pSat->pdActivity = __s;
  sVar15 = lVar12 * 4;
  pfVar2 = (float *)malloc(sVar15);
  pSat->pFactors = pfVar2;
  if (0 < lVar12) {
    lVar14 = 0;
    memset(__s,0,lVar12 * 8);
    do {
      pfVar2[lVar14] = 1.0;
      lVar14 = lVar14 + 1;
    } while (lVar12 != lVar14);
  }
  piVar3 = (int *)malloc(sVar15);
  pSat->pAssigns = piVar3;
  piVar4 = (int *)malloc(sVar15);
  pSat->pModel = piVar4;
  if (0 < pSat->nVarsAlloc) {
    uVar10 = 1;
    if (1 < pSat->nVarsAlloc) {
      uVar10 = (ulong)(uint)pSat->nVarsAlloc;
    }
    memset(piVar3,0xff,uVar10 << 2);
  }
  pMVar5 = Msat_OrderAlloc(pSat);
  pSat->pOrder = pMVar5;
  ppMVar6 = (Msat_ClauseVec_t **)malloc((long)pSat->nVarsAlloc << 4);
  pSat->pvWatched = ppMVar6;
  iVar13 = pSat->nVarsAlloc;
  if (0 < iVar13) {
    lVar12 = 0;
    do {
      pMVar1 = Msat_ClauseVecAlloc(0x10);
      pSat->pvWatched[lVar12] = pMVar1;
      lVar12 = lVar12 + 1;
      iVar13 = pSat->nVarsAlloc;
    } while (SBORROW8(lVar12,(long)iVar13 * 2) != lVar12 + (long)iVar13 * -2 < 0);
  }
  pMVar7 = Msat_QueueAlloc(iVar13);
  pSat->pQueue = pMVar7;
  pMVar8 = Msat_IntVecAlloc(pSat->nVarsAlloc);
  pSat->vTrail = pMVar8;
  pMVar8 = Msat_IntVecAlloc(pSat->nVarsAlloc);
  pSat->vTrailLim = pMVar8;
  iVar13 = pSat->nVarsAlloc;
  sVar15 = (long)iVar13 * 8;
  __s_00 = (Msat_Clause_t **)malloc(sVar15);
  pSat->pReasons = __s_00;
  memset(__s_00,0,sVar15);
  piVar3 = (int *)malloc((long)iVar13 << 2);
  pSat->pLevel = piVar3;
  if (0 < pSat->nVarsAlloc) {
    uVar10 = 1;
    if (1 < pSat->nVarsAlloc) {
      uVar10 = (ulong)(uint)pSat->nVarsAlloc;
    }
    memset(piVar3,0xff,uVar10 << 2);
  }
  pSat->dRandSeed = 91648253.0;
  pSat->fVerbose = fVerbose;
  pSat->dProgress = 0.0;
  pMVar9 = Msat_MmStepStart(10);
  pSat->pMem = pMVar9;
  pMVar8 = Msat_IntVecAlloc(pSat->nVarsAlloc);
  pSat->vConeVars = pMVar8;
  pMVar1 = Msat_ClauseVecAlloc(pSat->nVarsAlloc);
  pSat->vAdjacents = pMVar1;
  iVar13 = pSat->nVarsAlloc;
  if (0 < iVar13) {
    iVar11 = 0;
    do {
      pMVar1 = pSat->vAdjacents;
      pMVar8 = Msat_IntVecAlloc(5);
      Msat_ClauseVecPush(pMVar1,(Msat_Clause_t *)pMVar8);
      iVar11 = iVar11 + 1;
      iVar13 = pSat->nVarsAlloc;
    } while (iVar11 < iVar13);
  }
  pMVar8 = Msat_IntVecAlloc(iVar13);
  pSat->vVarsUsed = pMVar8;
  Msat_IntVecFill(pMVar8,pSat->nVarsAlloc,1);
  iVar13 = pSat->nVarsAlloc;
  sVar15 = (long)iVar13 << 2;
  piVar3 = (int *)malloc(sVar15);
  pSat->pSeen = piVar3;
  memset(piVar3,0,sVar15);
  pSat->nSeenId = 1;
  pMVar8 = Msat_IntVecAlloc(iVar13);
  pSat->vReason = pMVar8;
  pMVar8 = Msat_IntVecAlloc(pSat->nVarsAlloc);
  pSat->vTemp = pMVar8;
  return pSat;
}

Assistant:

Msat_Solver_t * Msat_SolverAlloc( int nVarsAlloc,
    double dClaInc, double dClaDecay, 
    double dVarInc, double dVarDecay, 
    int  fVerbose )
{
    Msat_Solver_t * p;
    int i;

    assert(sizeof(Msat_Lit_t) == sizeof(unsigned));
    assert(sizeof(float)     == sizeof(unsigned));

    p = ABC_ALLOC( Msat_Solver_t, 1 );
    memset( p, 0, sizeof(Msat_Solver_t) );

    p->nVarsAlloc = nVarsAlloc;
    p->nVars     = 0;

    p->nClauses  = 0;
    p->vClauses  = Msat_ClauseVecAlloc( 512 );
    p->vLearned  = Msat_ClauseVecAlloc( 512 );

    p->dClaInc   = dClaInc;
    p->dClaDecay = dClaDecay;
    p->dVarInc   = dVarInc;
    p->dVarDecay = dVarDecay;

    p->pdActivity = ABC_ALLOC( double, p->nVarsAlloc );
    p->pFactors   = ABC_ALLOC( float, p->nVarsAlloc );
    for ( i = 0; i < p->nVarsAlloc; i++ )
    {
        p->pdActivity[i] = 0.0;
        p->pFactors[i]   = 1.0;
    }

    p->pAssigns  = ABC_ALLOC( int, p->nVarsAlloc ); 
    p->pModel    = ABC_ALLOC( int, p->nVarsAlloc ); 
    for ( i = 0; i < p->nVarsAlloc; i++ )
        p->pAssigns[i] = MSAT_VAR_UNASSIGNED;
//    p->pOrder    = Msat_OrderAlloc( p->pAssigns, p->pdActivity, p->nVarsAlloc );
    p->pOrder    = Msat_OrderAlloc( p );

    p->pvWatched = ABC_ALLOC( Msat_ClauseVec_t *, 2 * p->nVarsAlloc );
    for ( i = 0; i < 2 * p->nVarsAlloc; i++ )
        p->pvWatched[i] = Msat_ClauseVecAlloc( 16 );
    p->pQueue    = Msat_QueueAlloc( p->nVarsAlloc );

    p->vTrail    = Msat_IntVecAlloc( p->nVarsAlloc );
    p->vTrailLim = Msat_IntVecAlloc( p->nVarsAlloc );
    p->pReasons  = ABC_ALLOC( Msat_Clause_t *, p->nVarsAlloc );
    memset( p->pReasons, 0, sizeof(Msat_Clause_t *) * p->nVarsAlloc );
    p->pLevel = ABC_ALLOC( int, p->nVarsAlloc );
    for ( i = 0; i < p->nVarsAlloc; i++ )
        p->pLevel[i] = -1;
    p->dRandSeed = 91648253;
    p->fVerbose  = fVerbose;
    p->dProgress = 0.0;
//    p->pModel = Msat_IntVecAlloc( p->nVarsAlloc );
    p->pMem = Msat_MmStepStart( 10 );

    p->vConeVars   = Msat_IntVecAlloc( p->nVarsAlloc ); 
    p->vAdjacents  = Msat_ClauseVecAlloc( p->nVarsAlloc );
    for ( i = 0; i < p->nVarsAlloc; i++ )
        Msat_ClauseVecPush( p->vAdjacents, (Msat_Clause_t *)Msat_IntVecAlloc(5) );
    p->vVarsUsed   = Msat_IntVecAlloc( p->nVarsAlloc ); 
    Msat_IntVecFill( p->vVarsUsed, p->nVarsAlloc, 1 );


    p->pSeen     = ABC_ALLOC( int, p->nVarsAlloc );
    memset( p->pSeen, 0, sizeof(int) * p->nVarsAlloc );
    p->nSeenId   = 1;
    p->vReason   = Msat_IntVecAlloc( p->nVarsAlloc );
    p->vTemp     = Msat_IntVecAlloc( p->nVarsAlloc );
    return p;
}